

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Bitmap.cxx
# Opt level: O2

int __thiscall Fl_Bitmap::copy(Fl_Bitmap *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  Fl_Bitmap *this_00;
  byte *bits;
  uint uVar4;
  int iVar5;
  int iVar6;
  int W;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  byte bVar11;
  ulong uVar12;
  ulong uVar13;
  int H;
  ulong uVar14;
  
  W = (int)dst;
  iVar1 = (this->super_Fl_Image).w_;
  iVar2 = (this->super_Fl_Image).h_;
  H = (int)src;
  if (iVar2 == H && iVar1 == W) {
    uVar13 = (ulong)(((W + 7) / 8) * H);
    puVar3 = (uchar *)operator_new__(uVar13);
    memcpy(puVar3,this->array,uVar13);
    this_00 = (Fl_Bitmap *)operator_new(0x38);
    Fl_Bitmap(this_00,puVar3,W,H);
    this_00->alloc_array = 1;
  }
  else if (H < 1 || W < 1) {
    this_00 = (Fl_Bitmap *)0x0;
  }
  else {
    uVar13 = (ulong)((W + 7U >> 3) * H);
    bits = (byte *)operator_new__(uVar13);
    this_00 = (Fl_Bitmap *)operator_new(0x38);
    Fl_Bitmap(this_00,bits,W,H);
    this_00->alloc_array = 1;
    iVar6 = 0;
    memset(bits,0,uVar13);
    uVar10 = (ulong)src & 0xffffffff;
    for (uVar13 = (ulong)src & 0xffffffff; 0 < (int)uVar13; uVar13 = (ulong)((int)uVar13 - 1)) {
      iVar5 = (this->super_Fl_Image).w_;
      puVar3 = this->array;
      uVar4 = 0;
      uVar12 = 1;
      uVar8 = (ulong)dst & 0xffffffff;
      uVar14 = (ulong)dst & 0xffffffff;
      while( true ) {
        bVar11 = (byte)uVar12;
        if ((int)uVar14 < 1) break;
        if ((puVar3[(long)((int)uVar4 / 8) + (long)(((iVar5 + 7) / 8) * iVar6)] >> (uVar4 & 7) & 1)
            != 0) {
          *bits = *bits | bVar11;
        }
        bits = bits + (uVar12 >> 7);
        uVar12 = (ulong)((int)uVar12 * 2 & 0xff);
        if ((char)bVar11 < '\0') {
          uVar12 = 1;
        }
        iVar7 = (int)uVar8 - iVar1 % W;
        iVar9 = 0;
        if (iVar7 < 1) {
          iVar9 = W;
        }
        uVar4 = uVar4 + iVar1 / W + (uint)(iVar7 < 1);
        uVar8 = (ulong)(uint)(iVar7 + iVar9);
        uVar14 = (ulong)((int)uVar14 - 1);
      }
      bits = bits + (1 < bVar11);
      iVar9 = (int)uVar10 - iVar2 % H;
      iVar5 = 0;
      if (iVar9 < 1) {
        iVar5 = H;
      }
      iVar6 = iVar6 + iVar2 / H + (uint)(iVar9 < 1);
      uVar10 = (ulong)(uint)(iVar9 + iVar5);
    }
  }
  return (int)this_00;
}

Assistant:

Fl_Image *Fl_Bitmap::copy(int W, int H) {
  Fl_Bitmap	*new_image;	// New RGB image
  uchar		*new_array;	// New array for image data

  // Optimize the simple copy where the width and height are the same...
  if (W == w() && H == h()) {
    new_array = new uchar [H * ((W + 7) / 8)];
    memcpy(new_array, array, H * ((W + 7) / 8));

    new_image = new Fl_Bitmap(new_array, W, H);
    new_image->alloc_array = 1;

    return new_image;
  }
  if (W <= 0 || H <= 0) return 0;

  // OK, need to resize the image data; allocate memory and 
  uchar		*new_ptr,	// Pointer into new array
		new_bit,	// Bit for new array
		old_bit;	// Bit for old array
  const uchar	*old_ptr;	// Pointer into old array
  int		sx, sy,		// Source coordinates
		dx, dy,		// Destination coordinates
		xerr, yerr,	// X & Y errors
		xmod, ymod,	// X & Y moduli
		xstep, ystep;	// X & Y step increments


  // Figure out Bresenham step/modulus values...
  xmod   = w() % W;
  xstep  = w() / W;
  ymod   = h() % H;
  ystep  = h() / H;

  // Allocate memory for the new image...
  new_array = new uchar [H * ((W + 7) / 8)];
  new_image = new Fl_Bitmap(new_array, W, H);
  new_image->alloc_array = 1;

  memset(new_array, 0, H * ((W + 7) / 8));

  // Scale the image using a nearest-neighbor algorithm...
  for (dy = H, sy = 0, yerr = H, new_ptr = new_array; dy > 0; dy --) {
    for (dx = W, xerr = W, old_ptr = array + sy * ((w() + 7) / 8), sx = 0, new_bit = 1;
	 dx > 0;
	 dx --) {
      old_bit = (uchar)(1 << (sx & 7));
      if (old_ptr[sx / 8] & old_bit) *new_ptr |= new_bit;

      if (new_bit < 128) new_bit <<= 1;
      else {
        new_bit = 1;
	new_ptr ++;
      }

      sx   += xstep;
      xerr -= xmod;

      if (xerr <= 0) {
	xerr += W;
	sx ++;
      }
    }

    if (new_bit > 1) new_ptr ++;

    sy   += ystep;
    yerr -= ymod;
    if (yerr <= 0) {
      yerr += H;
      sy ++;
    }
  }

  return new_image;
}